

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputIterator.hpp
# Opt level: O0

KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_> __thiscall
supermap::io::
InputIterator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_6UL,_void>::
next(InputIterator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_6UL,_void>
     *this)

{
  pointer pIVar1;
  long in_RSI;
  undefined8 in_RDI;
  KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_> KVar2;
  istream *in_stack_ffffffffffffffd8;
  
  *(char *)(in_RSI + 8) = *(char *)(in_RSI + 8) + '\x01';
  pIVar1 = std::
           unique_ptr<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>::
           operator->((unique_ptr<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>
                       *)0x15f7ed);
  (*(code *)**(undefined8 **)pIVar1)();
  KVar2 = deserialize<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>,void>
                    (in_stack_ffffffffffffffd8);
  KVar2._0_8_ = in_RDI;
  return KVar2;
}

Assistant:

T next() {
        ++index_;
        return deserialize<T>(input_->get());
    }